

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode init_wc_data(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *pcVar4;
  long *plVar5;
  ftp_parselist_data *pfVar6;
  ftp_wc_tmpdata *ftp_tmp;
  CURLcode result;
  WildcardData *wildcard;
  char *path;
  char *last_slash;
  connectdata *conn_local;
  
  pcVar4 = (conn->data->state).path;
  pCVar1 = conn->data;
  pcVar3 = strrchr((conn->data->state).path,0x2f);
  if (pcVar3 == (char *)0x0) {
    if (*pcVar4 == '\0') {
      (pCVar1->wildcard).state = CURLWC_CLEAN;
      CVar2 = ftp_parse_url_path(conn);
      return CVar2;
    }
    pcVar3 = (*Curl_cstrdup)(pcVar4);
    (pCVar1->wildcard).pattern = pcVar3;
    if ((pCVar1->wildcard).pattern == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *pcVar4 = '\0';
  }
  else {
    pcVar3 = pcVar3 + 1;
    if (*pcVar3 == '\0') {
      (pCVar1->wildcard).state = CURLWC_CLEAN;
      CVar2 = ftp_parse_url_path(conn);
      return CVar2;
    }
    pcVar4 = (*Curl_cstrdup)(pcVar3);
    (pCVar1->wildcard).pattern = pcVar4;
    if ((pCVar1->wildcard).pattern == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *pcVar3 = '\0';
  }
  plVar5 = (long *)(*Curl_ccalloc)(1,0x18);
  if (plVar5 == (long *)0x0) {
    (*Curl_cfree)((pCVar1->wildcard).pattern);
    (pCVar1->wildcard).pattern = (char *)0x0;
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pfVar6 = Curl_ftp_parselist_data_alloc();
    *plVar5 = (long)pfVar6;
    if (*plVar5 == 0) {
      (*Curl_cfree)((pCVar1->wildcard).pattern);
      (pCVar1->wildcard).pattern = (char *)0x0;
      (*Curl_cfree)(plVar5);
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      (pCVar1->wildcard).tmp = plVar5;
      (pCVar1->wildcard).tmp_dtor = wc_data_dtor;
      if ((conn->data->set).ftp_filemethod == FTPFILE_NOCWD) {
        (conn->data->set).ftp_filemethod = FTPFILE_MULTICWD;
      }
      conn_local._4_4_ = ftp_parse_url_path(conn);
      if (conn_local._4_4_ == CURLE_OK) {
        pcVar4 = (*Curl_cstrdup)((conn->data->state).path);
        (pCVar1->wildcard).path = pcVar4;
        if ((pCVar1->wildcard).path == (char *)0x0) {
          (*Curl_cfree)((pCVar1->wildcard).pattern);
          (pCVar1->wildcard).pattern = (char *)0x0;
          (*(pCVar1->wildcard).tmp_dtor)((pCVar1->wildcard).tmp);
          (pCVar1->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
          (pCVar1->wildcard).tmp = (void *)0x0;
          conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          plVar5[1] = (long)(conn->data->set).fwrite_func;
          (conn->data->set).fwrite_func = Curl_ftp_parselist;
          plVar5[2] = (long)(conn->data->set).out;
          (conn->data->set).out = conn;
          Curl_infof(conn->data,"Wildcard - Parsing started\n");
          conn_local._4_4_ = CURLE_OK;
        }
      }
      else {
        (*Curl_cfree)((pCVar1->wildcard).pattern);
        (pCVar1->wildcard).pattern = (char *)0x0;
        (*(pCVar1->wildcard).tmp_dtor)((pCVar1->wildcard).tmp);
        (pCVar1->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
        (pCVar1->wildcard).tmp = (void *)0x0;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode init_wc_data(struct connectdata *conn)
{
  char *last_slash;
  char *path = conn->data->state.path;
  struct WildcardData *wildcard = &(conn->data->wildcard);
  CURLcode result = CURLE_OK;
  struct ftp_wc_tmpdata *ftp_tmp;

  last_slash = strrchr(conn->data->state.path, '/');
  if(last_slash) {
    last_slash++;
    if(last_slash[0] == '\0') {
      wildcard->state = CURLWC_CLEAN;
      result = ftp_parse_url_path(conn);
      return result;
    }
    wildcard->pattern = strdup(last_slash);
    if(!wildcard->pattern)
      return CURLE_OUT_OF_MEMORY;
    last_slash[0] = '\0'; /* cut file from path */
  }
  else { /* there is only 'wildcard pattern' or nothing */
    if(path[0]) {
      wildcard->pattern = strdup(path);
      if(!wildcard->pattern)
        return CURLE_OUT_OF_MEMORY;
      path[0] = '\0';
    }
    else { /* only list */
      wildcard->state = CURLWC_CLEAN;
      result = ftp_parse_url_path(conn);
      return result;
    }
  }

  /* program continues only if URL is not ending with slash, allocate needed
     resources for wildcard transfer */

  /* allocate ftp protocol specific temporary wildcard data */
  ftp_tmp = calloc(1, sizeof(struct ftp_wc_tmpdata));
  if(!ftp_tmp) {
    Curl_safefree(wildcard->pattern);
    return CURLE_OUT_OF_MEMORY;
  }

  /* INITIALIZE parselist structure */
  ftp_tmp->parser = Curl_ftp_parselist_data_alloc();
  if(!ftp_tmp->parser) {
    Curl_safefree(wildcard->pattern);
    free(ftp_tmp);
    return CURLE_OUT_OF_MEMORY;
  }

  wildcard->tmp = ftp_tmp; /* put it to the WildcardData tmp pointer */
  wildcard->tmp_dtor = wc_data_dtor;

  /* wildcard does not support NOCWD option (assert it?) */
  if(conn->data->set.ftp_filemethod == FTPFILE_NOCWD)
    conn->data->set.ftp_filemethod = FTPFILE_MULTICWD;

  /* try to parse ftp url */
  result = ftp_parse_url_path(conn);
  if(result) {
    Curl_safefree(wildcard->pattern);
    wildcard->tmp_dtor(wildcard->tmp);
    wildcard->tmp_dtor = ZERO_NULL;
    wildcard->tmp = NULL;
    return result;
  }

  wildcard->path = strdup(conn->data->state.path);
  if(!wildcard->path) {
    Curl_safefree(wildcard->pattern);
    wildcard->tmp_dtor(wildcard->tmp);
    wildcard->tmp_dtor = ZERO_NULL;
    wildcard->tmp = NULL;
    return CURLE_OUT_OF_MEMORY;
  }

  /* backup old write_function */
  ftp_tmp->backup.write_function = conn->data->set.fwrite_func;
  /* parsing write function */
  conn->data->set.fwrite_func = Curl_ftp_parselist;
  /* backup old file descriptor */
  ftp_tmp->backup.file_descriptor = conn->data->set.out;
  /* let the writefunc callback know what curl pointer is working with */
  conn->data->set.out = conn;

  infof(conn->data, "Wildcard - Parsing started\n");
  return CURLE_OK;
}